

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::UpdateColumn
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,Vector *row_ids,
          vector<unsigned_long,_true> *column_path,DataChunk *updates)

{
  TransactionData transaction;
  DuckTransaction *transaction_p;
  RowGroupCollection *this_00;
  TransactionException *this_01;
  DataTableInfo *this_02;
  string local_a8;
  string local_88;
  string local_68;
  TransactionData local_48;
  
  DataChunk::Verify(updates);
  if (updates->count != 0) {
    if ((this->version)._M_i != MAIN_TABLE) {
      this_01 = (TransactionException *)__cxa_allocate_exception(0x10);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,
                 "Transaction conflict: attempting to update table \"%s\" but it has been %s by a different transaction"
                 ,"");
      this_02 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
      DataTableInfo::GetTableName_abi_cxx11_(&local_68,this_02);
      TableModification_abi_cxx11_(&local_88,this);
      TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
                (this_01,&local_a8,&local_68,&local_88);
      __cxa_throw(this_01,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    transaction_p = DuckTransaction::Get(context,this->db);
    DataChunk::Flatten(updates);
    Vector::Flatten(row_ids,updates->count);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
    TransactionData::TransactionData(&local_48,transaction_p);
    transaction.transaction_id = local_48.transaction_id;
    transaction.transaction.ptr = local_48.transaction.ptr;
    transaction.start_time = local_48.start_time;
    RowGroupCollection::UpdateColumn(this_00,transaction,row_ids,column_path,updates);
  }
  return;
}

Assistant:

void DataTable::UpdateColumn(TableCatalogEntry &table, ClientContext &context, Vector &row_ids,
                             const vector<column_t> &column_path, DataChunk &updates) {
	D_ASSERT(row_ids.GetType().InternalType() == ROW_TYPE);
	D_ASSERT(updates.ColumnCount() == 1);
	updates.Verify();
	if (updates.size() == 0) {
		return;
	}

	if (!IsMainTable()) {
		throw TransactionException(
		    "Transaction conflict: attempting to update table \"%s\" but it has been %s by a different transaction",
		    GetTableName(), TableModification());
	}

	// now perform the actual update
	auto &transaction = DuckTransaction::Get(context, db);

	updates.Flatten();
	row_ids.Flatten(updates.size());
	row_groups->UpdateColumn(transaction, row_ids, column_path, updates);
}